

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O3

void __thiscall Privkey_Privkey_Test::TestBody(Privkey_Privkey_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Privkey privkey;
  AssertHelper local_70 [3];
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [16];
  Privkey local_28;
  
  cfd::core::Privkey::Privkey(&local_28);
  cfd::core::Privkey::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  message = "";
  testing::internal::CmpHelperSTREQ
            (local_58,"privkey.GetData().GetHex().c_str()","\"\"",(char *)local_48[0].ptr_,"");
  if (local_48[0].ptr_ != local_38) {
    operator_delete(local_48[0].ptr_);
  }
  if (local_70[0].data_ != (AssertHelperData *)0x0) {
    operator_delete(local_70[0].data_);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_privkey.cpp"
               ,0x16,message);
    testing::internal::AssertHelper::operator=(local_70,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Privkey, Privkey) {
  Privkey privkey;
  EXPECT_STREQ(privkey.GetData().GetHex().c_str(), "");
}